

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_shared_secret(uint8_t *public_key,uint8_t *private_key,uint8_t *secret)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uECC_word_t *initialZ;
  undefined1 local_128 [8];
  EccPoint public;
  EccPoint product;
  uECC_word_t tmp [4];
  uECC_word_t random [4];
  uECC_word_t private [4];
  uECC_word_t *p2 [2];
  
  private[3] = (uECC_word_t)(random + 3);
  lVar7 = 0;
  initialZ = tmp + 3;
  do {
    iVar2 = (*g_rng_function)((uint8_t *)initialZ,0x20);
    if (iVar2 != 0) {
      lVar3 = 0;
      do {
        if (tmp[lVar3 + 3] != 0) goto LAB_0011709f;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x40);
  initialZ = (uECC_word_t *)0x0;
LAB_0011709f:
  vli_bytesToNative(random + 3,private_key);
  vli_bytesToNative((uint64_t *)local_128,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  lVar7 = 0;
  uVar4 = 0;
  do {
    uVar1 = *(ulong *)((long)random + lVar7 + 0x18);
    uVar6 = uVar1 + uVar4 + *(long *)((long)curve_n + lVar7);
    uVar5 = (ulong)(uVar6 < uVar1);
    if (uVar6 == uVar1) {
      uVar5 = uVar4;
    }
    *(ulong *)((long)random + lVar7 + 0x18) = uVar6;
    lVar7 = lVar7 + 8;
    uVar4 = uVar5;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  uVar4 = 0;
  do {
    uVar1 = *(ulong *)((long)random + lVar7 + 0x18);
    uVar6 = uVar1 + uVar4 + *(long *)((long)curve_n + lVar7);
    if (uVar6 != uVar1) {
      uVar4 = (ulong)(uVar6 < uVar1);
    }
    *(ulong *)((long)product.y + lVar7 + 0x18) = uVar6;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  EccPoint_mult((EccPoint *)(public.y + 3),(EccPoint *)local_128,
                (uECC_word_t *)private[(uVar5 ^ 1) + 3],initialZ,(bitcount_t)uVar6);
  vli_nativeToBytes(secret,(uint64_t *)(public.y + 3));
  lVar7 = 0;
  do {
    if (public.y[lVar7 + 3] != 0) {
      return 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    if (product.x[lVar7 + 3] != 0) {
      return 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  return 0;
}

Assistant:

int uECC_shared_secret(const uint8_t public_key[uECC_BYTES*2],
                       const uint8_t private_key[uECC_BYTES],
                       uint8_t secret[uECC_BYTES]) {
    EccPoint public;
    EccPoint product;
    uECC_word_t private[uECC_WORDS];
    uECC_word_t tmp[uECC_WORDS];
    uECC_word_t *p2[2] = {private, tmp};
    uECC_word_t random[uECC_WORDS];
    uECC_word_t *initial_Z = 0;
    uECC_word_t tries;
    uECC_word_t carry;

    // Try to get a random initial Z value to improve protection against side-channel
    // attacks. If the RNG fails every time (eg it was not defined), we continue so that
    // uECC_shared_secret() can still work without an RNG defined.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (g_rng_function((uint8_t *)random, sizeof(random)) && !vli_isZero(random)) {
            initial_Z = random;
            break;
        }
    }

    vli_bytesToNative(private, private_key);
    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

#if (uECC_CURVE == uECC_secp160r1)
    // Don't regularize the bitcount for secp160r1.
    EccPoint_mult(&product, &public, private, initial_Z, vli_numBits(private, uECC_WORDS));
#else
    // Regularize the bitcount for the private key so that attackers cannot use a side channel
    // attack to learn the number of leading zeros.
    carry = vli_add(private, private, curve_n);
    vli_add(tmp, private, curve_n);
    EccPoint_mult(&product, &public, p2[!carry], initial_Z, (uECC_BYTES * 8) + 1);
#endif

    vli_nativeToBytes(secret, product.x);
    return !EccPoint_isZero(&product);
}